

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O0

void av1_init_single_pass_lap(AV1_COMP *cpi)

{
  AV1_PRIMARY *pAVar1;
  TWO_PASS *twopass;
  AV1_COMP *cpi_local;
  
  pAVar1 = cpi->ppi;
  if (((pAVar1->twopass).stats_buf_ctx)->stats_in_end != (FIRSTPASS_STATS *)0x0) {
    (pAVar1->twopass).sr_update_lag = 1;
    (pAVar1->twopass).bits_left = 0;
    (pAVar1->twopass).modified_error_min = 0.0;
    (pAVar1->twopass).modified_error_max = 0.0;
    (pAVar1->twopass).modified_error_left = 0.0;
    (cpi->ppi->p_rc).vbr_bits_off_target = 0;
    (cpi->ppi->p_rc).vbr_bits_off_target_fast = 0;
    (cpi->ppi->p_rc).rate_error_estimate = 0;
    (pAVar1->twopass).kf_zeromotion_pct = 100;
    (pAVar1->twopass).last_kfgroup_zeromotion_pct = 100;
    (pAVar1->twopass).bpm_factor = 1.0;
    (pAVar1->twopass).rolling_arf_group_target_bits = 1;
    (pAVar1->twopass).rolling_arf_group_actual_bits = 1;
  }
  return;
}

Assistant:

void av1_init_single_pass_lap(AV1_COMP *cpi) {
  TWO_PASS *const twopass = &cpi->ppi->twopass;

  if (!twopass->stats_buf_ctx->stats_in_end) return;

  // This variable monitors how far behind the second ref update is lagging.
  twopass->sr_update_lag = 1;

  twopass->bits_left = 0;
  twopass->modified_error_min = 0.0;
  twopass->modified_error_max = 0.0;
  twopass->modified_error_left = 0.0;

  // Reset the vbr bits off target counters
  cpi->ppi->p_rc.vbr_bits_off_target = 0;
  cpi->ppi->p_rc.vbr_bits_off_target_fast = 0;

  cpi->ppi->p_rc.rate_error_estimate = 0;

  // Static sequence monitor variables.
  twopass->kf_zeromotion_pct = 100;
  twopass->last_kfgroup_zeromotion_pct = 100;

  // Initialize bits per macro_block estimate correction factor.
  twopass->bpm_factor = 1.0;
  // Initialize actual and target bits counters for ARF groups so that
  // at the start we have a neutral bpm adjustment.
  twopass->rolling_arf_group_target_bits = 1;
  twopass->rolling_arf_group_actual_bits = 1;
}